

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_functions.cpp
# Opt level: O3

void duckdb::EnumRangeFunction(DataChunk *input,ExpressionState *state,Vector *result)

{
  reference pvVar1;
  idx_t iVar2;
  Vector *this;
  idx_t index;
  vector<duckdb::Value,_true> enum_values;
  vector<duckdb::LogicalType,_true> types;
  Value val;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_d8;
  vector<duckdb::Value,_true> local_b8;
  LogicalType local_a0;
  vector<duckdb::LogicalType,_true> local_88;
  Value local_70;
  
  DataChunk::GetTypes(&local_88,input);
  pvVar1 = vector<duckdb::LogicalType,_true>::operator[](&local_88,0);
  iVar2 = EnumType::GetSize(pvVar1);
  pvVar1 = vector<duckdb::LogicalType,_true>::operator[](&local_88,0);
  this = EnumType::GetValuesInsertOrder(pvVar1);
  local_d8.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (iVar2 != 0) {
    index = 0;
    do {
      Vector::GetValue(&local_70,this,index);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_d8,&local_70);
      Value::~Value(&local_70);
      index = index + 1;
    } while (iVar2 != index);
  }
  LogicalType::LogicalType(&local_a0,VARCHAR);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_b8,&local_d8);
  Value::LIST(&local_70,&local_a0,&local_b8);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_b8);
  LogicalType::~LogicalType(&local_a0);
  Vector::Reference(result,&local_70);
  Value::~Value(&local_70);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_d8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_88);
  return;
}

Assistant:

static void EnumRangeFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	auto types = input.GetTypes();
	D_ASSERT(types.size() == 1);
	auto enum_size = EnumType::GetSize(types[0]);
	auto &enum_vector = EnumType::GetValuesInsertOrder(types[0]);
	vector<Value> enum_values;
	for (idx_t i = 0; i < enum_size; i++) {
		enum_values.emplace_back(enum_vector.GetValue(i));
	}
	auto val = Value::LIST(LogicalType::VARCHAR, enum_values);
	result.Reference(val);
}